

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

stumpless_target * stumpless_open_buffer_target(char *name,char *buffer,size_t size)

{
  stumpless_target *target_00;
  buffer_target *pbVar1;
  stumpless_target *target;
  size_t size_local;
  char *buffer_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else if (buffer == (char *)0x0) {
    raise_argument_empty("buffer was NULL");
  }
  else {
    target_00 = new_target(STUMPLESS_BUFFER_TARGET,name);
    if (target_00 != (stumpless_target *)0x0) {
      pbVar1 = new_buffer_target(buffer,size);
      target_00->id = pbVar1;
      if (target_00->id != (stumpless_id_t)0x0) {
        stumpless_set_current_target(target_00);
        return target_00;
      }
      destroy_target(target_00);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_buffer_target( const char *name,
                              char *buffer,
                              size_t size ) {
  struct stumpless_target *target;

  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( buffer );

  target = new_target( STUMPLESS_BUFFER_TARGET, name );

  if( !target ) {
    goto fail;
  }

  target->id = new_buffer_target( buffer, size );
  if( !target->id ) {
    goto fail_id;
  }

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}